

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmTst<(moira::Instr)128,(moira::Mode)11,4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  Syntax SVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  char *pcVar5;
  char cVar6;
  Ea<(moira::Mode)11,_4> ea;
  u32 local_34;
  ushort local_30;
  uint local_2c;
  
  local_30 = op & 7;
  local_34 = *addr;
  *addr = local_34 + 2;
  iVar2 = (*this->_vptr_Moira[6])();
  *addr = *addr + 2;
  uVar3 = (*this->_vptr_Moira[6])(this);
  local_2c = uVar3 & 0xffff | iVar2 << 0x10;
  cVar6 = 't';
  lVar4 = 1;
  do {
    pcVar5 = str->ptr;
    str->ptr = pcVar5 + 1;
    *pcVar5 = cVar6;
    cVar6 = "btst"[lVar4 + 1];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  pcVar5 = str->ptr;
  SVar1 = str->style->syntax;
  str->ptr = pcVar5 + 1;
  if (2 < SVar1 - MOIRA_MIT) {
    *pcVar5 = '.';
    pcVar5 = str->ptr;
    str->ptr = pcVar5 + 1;
  }
  *pcVar5 = 'l';
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    pcVar5 = str->ptr;
    str->ptr = pcVar5 + 1;
    *pcVar5 = ' ';
  }
  else {
    iVar2 = (str->tab).raw;
    pcVar5 = str->ptr;
    do {
      str->ptr = pcVar5 + 1;
      *pcVar5 = ' ';
      pcVar5 = str->ptr;
    } while (pcVar5 < str->base + iVar2);
  }
  StrWriter::operator<<(str,(Ea<(moira::Mode)11,_4> *)&local_34);
  if ((str->style->syntax & ~MOIRA_MIT) != GNU) {
    cVar6 = ';';
    lVar4 = 1;
    do {
      pcVar5 = str->ptr;
      str->ptr = pcVar5 + 1;
      *pcVar5 = cVar6;
      cVar6 = "trap%-2s  ; (2+)"[lVar4 + 10];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 7);
  }
  return;
}

Assistant:

void
Moira::dasmTst(StrWriter &str, u32 &addr, u16 op) const
{
    auto ea = Op <M,S> ( _____________xxx(op), addr );

    str << Ins<I>{} << Sz<S>{} << str.tab << ea;
    str << Av<I, M, S>{};
}